

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDComponentPtrPair __thiscall ON_SubDFace::VertexEdgePair(ON_SubDFace *this,uint vertex_index)

{
  ON_SubDVertex *pOVar1;
  ON_SubDVertex *pOVar2;
  ON_SubDComponentPtr first_ptr;
  ON_SubDComponentPtr second_ptr;
  uint uVar3;
  ON_SubDComponentPtrPair OVar4;
  ON_SubDComponentPtrPair OVar5;
  ON_SubDEdgePtr *local_90;
  ON_SubDEdgePtr *local_80;
  ON_SubDVertex *v;
  ON_SubDEdgePtr eptr [2];
  uint fei0;
  uint edge_count;
  uint vertex_index_local;
  ON_SubDFace *this_local;
  ON_SubDComponentPtr local_10;
  
  uVar3 = (uint)this->m_edge_count;
  if (((2 < uVar3) && (vertex_index < uVar3)) &&
     ((uVar3 < 5 || (this->m_edgex != (ON_SubDEdgePtr *)0x0)))) {
    uVar3 = (vertex_index + (uVar3 - 1)) % uVar3;
    if (uVar3 < 4) {
      local_80 = this->m_edge4 + uVar3;
    }
    else {
      local_80 = this->m_edgex + (uVar3 - 4);
    }
    v = (ON_SubDVertex *)local_80->m_ptr;
    if (vertex_index < 4) {
      local_90 = this->m_edge4 + vertex_index;
    }
    else {
      local_90 = this->m_edgex + (vertex_index - 4);
    }
    eptr[0].m_ptr = local_90->m_ptr;
    pOVar1 = ON_SubDEdgePtr::RelativeVertex((ON_SubDEdgePtr *)&v,1);
    if ((pOVar1 != (ON_SubDVertex *)0x0) &&
       (pOVar2 = ON_SubDEdgePtr::RelativeVertex(eptr,0), pOVar1 == pOVar2)) {
      first_ptr = ON_SubDComponentPtr::Create((ON_SubDEdgePtr)v);
      second_ptr = ON_SubDComponentPtr::Create(eptr[0]);
      OVar4 = ON_SubDComponentPtrPair::Create(first_ptr,second_ptr);
      OVar4.m_pair[0].m_ptr = OVar4.m_pair[0].m_ptr;
      OVar4.m_pair[1].m_ptr = OVar4.m_pair[1].m_ptr;
      return (ON_SubDComponentPtrPair)OVar4.m_pair;
    }
  }
  OVar5.m_pair[0].m_ptr = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
  OVar5.m_pair[1].m_ptr = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
  return (ON_SubDComponentPtrPair)OVar5.m_pair;
}

Assistant:

const ON_SubDComponentPtrPair ON_SubDFace::VertexEdgePair(
  unsigned vertex_index
) const
{
  for (;;)
  {
    const unsigned edge_count = m_edge_count;
    if (edge_count < 3)
      break;
    if (vertex_index >= edge_count)
      break;
    if (edge_count > 4 && nullptr == m_edgex)
      break;
    const unsigned fei0 = (vertex_index + (edge_count - 1)) % edge_count;
    const ON_SubDEdgePtr eptr[2] =
    {
      (fei0 < 4 ? m_edge4[fei0] : m_edgex[fei0 - 4]),
      (vertex_index < 4 ? m_edge4[vertex_index] : m_edgex[vertex_index - 4]),
    };
    const ON_SubDVertex* v = eptr[0].RelativeVertex(1);
    if (nullptr == v || v != eptr[1].RelativeVertex(0))
      break;
    return ON_SubDComponentPtrPair::Create( ON_SubDComponentPtr::Create(eptr[0]), ON_SubDComponentPtr::Create(eptr[1]) );
  }
  return ON_SubDComponentPtrPair::Null;
}